

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-test.cpp
# Opt level: O3

void updtMem(FOCC_OTA *foccOta,int mTid)

{
  long *plVar1;
  FILE *__stream;
  uint uVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  tm *ptVar7;
  long lVar8;
  double dVar9;
  int locVal;
  time_t exitTime;
  time_t enterTime;
  char buf [40];
  uint local_98;
  uint local_94;
  long local_90;
  int local_88;
  uint local_84;
  uint local_80;
  int local_7c;
  long local_78;
  long local_70;
  pthread_t local_68;
  long local_60;
  char local_58 [40];
  
  if (0 < glb::numTrans) {
    local_78 = (long)mTid;
    local_88 = 0;
    do {
      local_70 = std::chrono::_V2::system_clock::now();
      uVar6 = 0;
      do {
        local_84 = uVar6;
        local_94 = FOCC_OTA::begin_trans(glb::foccOta);
        iVar4 = rand();
        if (-1 < iVar4 % glb::M) {
          iVar4 = iVar4 % glb::M + 1;
          do {
            local_7c = iVar4;
            iVar4 = rand();
            lVar8 = (long)glb::M;
            local_80 = (uint)((long)iVar4 % lVar8);
            iVar5 = rand();
            uVar6 = local_94;
            iVar5 = iVar5 % glb::constVal;
            FOCC_OTA::read(glb::foccOta,local_94,(void *)((long)iVar4 % lVar8 & 0xffffffff),
                           (size_t)&local_98);
            local_90 = std::chrono::_V2::system_clock::now();
            local_90 = local_90 / 1000000000;
            ptVar7 = localtime(&local_90);
            strftime(local_58,0x28,"%H:%M:%S",ptVar7);
            __stream = glb::log_file;
            local_68 = pthread_self();
            uVar2 = local_80;
            fprintf(__stream,"Thread ID %ld Transaction %d reads from %d a value %d at time %s\n",
                    local_68,(ulong)uVar6,(ulong)local_80,(ulong)local_98,local_58);
            local_98 = iVar5 + local_98;
            FOCC_OTA::write(glb::foccOta,uVar6,(void *)(ulong)uVar2,(ulong)local_98);
            local_60 = std::chrono::_V2::system_clock::now();
            local_60 = local_60 / 1000000000;
            ptVar7 = localtime(&local_60);
            strftime(local_58,0x28,"%H:%M:%S",ptVar7);
            fprintf(glb::log_file,
                    "Thread ID %ld Transaction %d writes to %d a value %d at time %s\n",local_68,
                    (ulong)uVar6,(ulong)uVar2,(ulong)local_98,local_58);
            dVar9 = std::
                    generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                              ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                *)&glb::generator);
            dVar9 = log(1.0 - dVar9);
            usleep((__useconds_t)(long)((dVar9 / glb::dist) * -1000.0));
            iVar4 = local_7c + -1;
          } while (iVar4 != 0);
        }
        uVar6 = local_94;
        cVar3 = FOCC_OTA::tryC(glb::foccOta,local_94);
        local_90 = std::chrono::_V2::system_clock::now();
        local_90 = local_90 / 1000000000;
        ptVar7 = localtime(&local_90);
        strftime(local_58,0x28,"%H:%M:%S",ptVar7);
        fprintf(glb::log_file,"Transaction %d tryCommits with result %c at time %s\n\n",(ulong)uVar6
                ,(ulong)(uint)(int)cVar3,local_58);
        uVar2 = local_84;
        uVar6 = (cVar3 == 'a') + local_84;
      } while (cVar3 != 'c');
      lVar8 = std::chrono::_V2::system_clock::now();
      plVar1 = (long *)(glb::total_delay + local_78 * 8);
      *plVar1 = *plVar1 + (lVar8 - local_70) / 1000000;
      plVar1 = (long *)(glb::total_aborts + local_78 * 8);
      *plVar1 = *plVar1 + (ulong)uVar2;
      local_88 = local_88 + 1;
    } while (local_88 < glb::numTrans);
  }
  return;
}

Assistant:

void updtMem(FOCC_OTA* foccOta, int mTid){
    int abortCnt = 0;
    char status = glb::TRANS_ABORT;

    char buf[40];
    // each thread invokes numTrans Transactions!
    for(int curTrans=0; curTrans<glb::numTrans; curTrans++){
        abortCnt = 0;
        auto start = high_resolution_clock::now();
        do {
            int id = glb::foccOta->begin_trans();
            int nItr = rand()%glb::M + 1;

            int locVal;

            for(int i=0; i<nItr; i++){
                // rnadom index to be updated.
                int randInd = rand()%glb::M;
                int randVal = rand()%glb::constVal;

                glb::foccOta->read(id, randInd, &locVal);

                auto _reqTime = std::chrono::system_clock::now();
                time_t reqTime = std::chrono::system_clock::to_time_t(_reqTime);
                struct tm* tinfo= localtime(&reqTime);
                strftime (buf, sizeof (buf), "%H:%M:%S", tinfo);
                fprintf(glb::log_file,"Thread ID %ld Transaction %d reads from %d a value %d at time %s\n", std::this_thread::get_id()
                        , id, randInd, locVal, buf);

                locVal+=randVal;

                glb::foccOta->write(id, randInd, locVal);

                auto _enterTime = std::chrono::system_clock::now(); //the timepoint
                auto enterTime = std::chrono::system_clock::to_time_t(_enterTime);
                tinfo= localtime(&enterTime);
                strftime (buf, sizeof (buf), "%H:%M:%S", tinfo);

                fprintf(glb::log_file,"Thread ID %ld Transaction %d writes to %d a value %d at time %s\n", std::this_thread::get_id()
                        , id, randInd, locVal, buf);

                usleep(1000*glb::dist(glb::generator));
            }

            status = glb::foccOta->tryC(id);

            auto _exitTime = std::chrono::system_clock::now(); //the timepoint
            auto exitTime = std::chrono::system_clock::to_time_t(_exitTime);
            struct tm* tinfo= localtime(&exitTime);
            strftime (buf, sizeof (buf), "%H:%M:%S", tinfo);
            fprintf(glb::log_file,"Transaction %d tryCommits with result %c at time %s\n\n", id, status, buf);
            //fprintf(stdout,"Transaction %d tryCommits with result %c\n", id, status);

            if(status == glb::TRANS_ABORT) {abortCnt++;}

        } while(status!=glb::TRANS_COMMIT);

        auto time_to_commit = duration_cast<milliseconds>(high_resolution_clock::now() - start);
        glb::total_delay[mTid]+=time_to_commit.count();
        glb::total_aborts[mTid]+=abortCnt;
    } // for
}